

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

FileDescriptor * __thiscall
google::protobuf::DescriptorPool::BuildFileFromDatabase
          (DescriptorPool *this,FileDescriptorProto *proto)

{
  pointer pTVar1;
  string *psVar2;
  size_type sVar3;
  DescriptorPool *pDVar4;
  DescriptorBuilder local_138;
  DescriptorPool *local_28;
  FileDescriptor *result;
  FileDescriptorProto *proto_local;
  DescriptorPool *this_local;
  
  result = (FileDescriptor *)proto;
  proto_local = (FileDescriptorProto *)this;
  internal::WrappedMutex::AssertHeld(this->mutex_);
  pTVar1 = std::
           unique_ptr<google::protobuf::DescriptorPool::Tables,_std::default_delete<google::protobuf::DescriptorPool::Tables>_>
           ::operator->(&this->tables_);
  psVar2 = FileDescriptorProto::name_abi_cxx11_((FileDescriptorProto *)result);
  sVar3 = std::
          unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::count(&pTVar1->known_bad_files_,psVar2);
  if (sVar3 == 0) {
    pTVar1 = std::
             unique_ptr<google::protobuf::DescriptorPool::Tables,_std::default_delete<google::protobuf::DescriptorPool::Tables>_>
             ::get(&this->tables_);
    DescriptorBuilder::DescriptorBuilder(&local_138,this,pTVar1,this->default_error_collector_);
    pDVar4 = (DescriptorPool *)
             DescriptorBuilder::BuildFile(&local_138,(FileDescriptorProto *)result);
    DescriptorBuilder::~DescriptorBuilder(&local_138);
    local_28 = pDVar4;
    if (pDVar4 == (DescriptorPool *)0x0) {
      pTVar1 = std::
               unique_ptr<google::protobuf::DescriptorPool::Tables,_std::default_delete<google::protobuf::DescriptorPool::Tables>_>
               ::operator->(&this->tables_);
      psVar2 = FileDescriptorProto::name_abi_cxx11_((FileDescriptorProto *)result);
      std::
      unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::insert(&pTVar1->known_bad_files_,psVar2);
    }
    this_local = local_28;
  }
  else {
    this_local = (DescriptorPool *)0x0;
  }
  return (FileDescriptor *)this_local;
}

Assistant:

const FileDescriptor* DescriptorPool::BuildFileFromDatabase(
    const FileDescriptorProto& proto) const {
  mutex_->AssertHeld();
  if (tables_->known_bad_files_.count(proto.name()) > 0) {
    return nullptr;
  }
  const FileDescriptor* result =
      DescriptorBuilder(this, tables_.get(), default_error_collector_)
          .BuildFile(proto);
  if (result == nullptr) {
    tables_->known_bad_files_.insert(proto.name());
  }
  return result;
}